

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDAWBIC.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  ostream *poVar1;
  double dVar2;
  vector<double,_std::allocator<double>_> alpha;
  vector<double,_std::allocator<double>_> beta;
  BOWFileParser parser;
  allocator local_2f1;
  vector<double,_std::allocator<double>_> local_2f0;
  vector<double,_std::allocator<double>_> local_2d8;
  string local_2c0;
  string local_2a0;
  string local_280;
  BOWFileParser local_260;
  
  std::__cxx11::string::string((string *)&local_280,argv[1],(allocator *)&local_2f0);
  BOWFileParser::BOWFileParser(&local_260,&local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  std::__cxx11::string::string((string *)&local_2a0,argv[2],(allocator *)&local_2d8);
  readHyperParam(&local_2f0,&local_2a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p);
  }
  std::__cxx11::string::string((string *)&local_2c0,argv[3],&local_2f1);
  readHyperParam(&local_2d8,&local_2c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p);
  }
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  local_2f1 = (allocator)0x2c;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_2f1,1);
  dVar2 = runWBICMetropolis(&local_260._frequencyMatrix,&local_260._docVoca,&local_2f0,&local_2d8,0)
  ;
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_2d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_2f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  BOWFileParser::~BOWFileParser(&local_260);
  return 0;
}

Assistant:

int main(int argc, char *argv[]){
    BOWFileParser parser(argv[1]);
    vector<double> alpha = readHyperParam(argv[2]);
    vector<double> beta = readHyperParam(argv[3]);
    unsigned int n;
    if(argc == 5){
        n = atoi(argv[4]);
    }
    cout<<alpha.size()<<','<<runWBICMetropolis(parser.getFrequencyMatrix(), parser.getDocVoca(), alpha, beta)<<endl;
    return 0;
}